

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<const_double>::operator==(ArrayPtr<const_double> *this,ArrayPtr<const_double> *other)

{
  double dVar1;
  double *pdVar2;
  ulong local_28;
  size_t i;
  ArrayPtr<const_double> *other_local;
  ArrayPtr<const_double> *this_local;
  
  if (this->size_ == other->size_) {
    for (local_28 = 0; local_28 < this->size_; local_28 = local_28 + 1) {
      dVar1 = this->ptr[local_28];
      pdVar2 = operator[](other,local_28);
      if ((dVar1 != *pdVar2) || (NAN(dVar1) || NAN(*pdVar2))) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
    if (isIntegral<RemoveConst<T>>()) {
      if (size_ == 0) return true;
      return __builtin_memcmp(ptr, other.ptr, size_ * sizeof(T)) == 0;
    }
#endif
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }